

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimacs_parser.cpp
# Opt level: O0

bool Satyricon::parse_file(SATSolver *solver,istream *is)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  istream *piVar4;
  void *this;
  long lVar5;
  char *pcVar6;
  long *plVar7;
  domain_error *pdVar8;
  Literal local_47c;
  int local_478;
  byte local_472;
  undefined1 local_471;
  undefined1 local_470 [6];
  bool conflict;
  allocator local_449;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  undefined1 local_401;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  istringstream local_3e0 [8];
  istringstream iss_1;
  uint local_25c;
  undefined1 local_258 [4];
  int value;
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> c;
  string local_238 [4];
  uint read_clausole;
  string other;
  string cnf;
  string p;
  istringstream iss;
  undefined1 local_48 [8];
  string line;
  uint number_of_variable;
  uint number_of_clausole;
  istream *is_local;
  SATSolver *solver_local;
  
  line.field_2._12_4_ = 0;
  line.field_2._8_4_ = 0;
  std::__cxx11::string::string((string *)local_48);
  do {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)local_48);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar1) goto LAB_00139fe6;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
  } while (*pcVar6 == 'c');
  std::__cxx11::istringstream::istringstream((istringstream *)((long)&p.field_2 + 8),local_48,8);
  std::__cxx11::string::string((string *)(cnf.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(other.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_238);
  piVar4 = std::operator>>((istream *)(p.field_2._M_local_buf + 8),
                           (string *)(cnf.field_2._M_local_buf + 8));
  piVar4 = std::operator>>(piVar4,(string *)(other.field_2._M_local_buf + 8));
  this = (void *)std::istream::operator>>(piVar4,(uint *)(line.field_2._M_local_buf + 8));
  plVar7 = (long *)std::istream::operator>>(this,(uint *)(line.field_2._M_local_buf + 0xc));
  bVar2 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
  if ((bVar2 & 1) == 0) {
    piVar4 = std::operator>>((istream *)(p.field_2._M_local_buf + 8),local_238);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (((!bVar1) &&
        (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&cnf.field_2 + 8),"p"), !bVar1)) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&other.field_2 + 8),"cnf"), !bVar1)) {
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string((string *)(other.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(cnf.field_2._M_local_buf + 8));
      std::__cxx11::istringstream::~istringstream((istringstream *)(p.field_2._M_local_buf + 8));
LAB_00139fe6:
      SATSolver::set_number_of_variable(solver,line.field_2._8_4_);
      c.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::vector
                ((vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *)local_258);
      do {
        do {
          piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             (is,(string *)local_48);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
          if (!bVar1 || (uint)line.field_2._12_4_ <=
                        c.
                        super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
            solver_local._7_1_ = 0;
            local_478 = 1;
            goto LAB_0013a43f;
          }
          lVar5 = std::__cxx11::string::size();
        } while ((lVar5 == 0) ||
                (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar6 == 'c')
                );
        std::__cxx11::istringstream::istringstream(local_3e0,local_48,8);
        do {
          while( true ) {
            bVar2 = std::ios::eof();
            if (((bVar2 ^ 0xff) & 1) == 0) {
              local_478 = 0;
              goto LAB_0013a406;
            }
            plVar7 = (long *)std::istream::operator>>(local_3e0,(int *)&local_25c);
            bVar2 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
            if ((bVar2 & 1) != 0) {
              local_401 = 1;
              pdVar8 = (domain_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_400,"invalid simbol on clausole ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_48);
              std::domain_error::domain_error(pdVar8,(string *)&local_400);
              local_401 = 0;
              __cxa_throw(pdVar8,&std::domain_error::typeinfo,std::domain_error::~domain_error);
            }
            uVar3 = local_25c;
            if ((int)local_25c < 1) {
              uVar3 = -local_25c;
            }
            if ((uint)line.field_2._8_4_ < uVar3) {
              local_471 = 1;
              pdVar8 = (domain_error *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_448,"invalid variable ",&local_449);
              std::__cxx11::to_string((string *)local_470,local_25c);
              std::operator+(&local_428,&local_448,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_470);
              std::domain_error::domain_error(pdVar8,(string *)&local_428);
              local_471 = 0;
              __cxa_throw(pdVar8,&std::domain_error::typeinfo,std::domain_error::~domain_error);
            }
            if (local_25c == 0) break;
            uVar3 = local_25c;
            if ((int)local_25c < 1) {
              uVar3 = -local_25c;
            }
            Literal::Literal(&local_47c,uVar3 - 1,SUB41(local_25c >> 0x1f,0));
            std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::push_back
                      ((vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *)local_258,
                       &local_47c);
          }
          c.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               c.super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          local_472 = SATSolver::add_clause
                                (solver,(vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                                         *)local_258);
          std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::clear
                    ((vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *)local_258);
        } while ((local_472 & 1) == 0);
        solver_local._7_1_ = 1;
        local_478 = 1;
LAB_0013a406:
        std::__cxx11::istringstream::~istringstream(local_3e0);
      } while (local_478 == 0);
LAB_0013a43f:
      std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::~vector
                ((vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *)local_258);
      std::__cxx11::string::~string((string *)local_48);
      return (bool)(solver_local._7_1_ & 1);
    }
  }
  pdVar8 = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error
            (pdVar8,"expected a \'p cnf NUMBER_OF_VARIABLE NUMBER_OF_CLAUSOLE\' as first line");
  __cxa_throw(pdVar8,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

bool Satyricon::parse_file(SATSolver& solver, std::istream & is)
{
    unsigned int number_of_clausole = 0, number_of_variable = 0;
    std::string line;

    // find header line
    while (getline(is, line)) {
        if (line[0] == 'c') continue;

        std::istringstream iss(line);
        std::string p, cnf, other;

        if ( !(iss >> p >> cnf >> number_of_variable >> number_of_clausole)
                || (iss >> other) || p != "p" || cnf != "cnf")
            throw std::domain_error(
                    "expected a 'p cnf NUMBER_OF_VARIABLE NUMBER_OF_CLAUSOLE'"
                    " as first line");
        break;
    }
    solver.set_number_of_variable(number_of_variable);

    unsigned int read_clausole = 0;
    // read clausoles

    std::vector<Literal> c;
    int value;

    while (getline(is, line) && read_clausole < number_of_clausole ) {
        if ( line.size() == 0 || line[0] == 'c') continue;

        std::istringstream iss(line);

        while( !iss.eof() ) {
            if ( !(iss >> value) )
                throw std::domain_error("invalid simbol on clausole " + line);
            if(static_cast<unsigned int>(abs(value)) > number_of_variable)
                throw std::domain_error(std::string("invalid variable ")+std::to_string(value));

            if (value == 0) {
                read_clausole++;
                bool conflict = solver.add_clause(c);
                c.clear();
                if ( conflict ) return true; // found a conflict
            }
            else {
                c.push_back( Literal(abs(value)-1, value < 0) );
            }
        }
    }

    return false; // no conflict
}